

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O3

void __thiscall Logger::~Logger(Logger *this)

{
  Buffer *logline;
  char **ppcVar1;
  size_t __n;
  pointer pcVar2;
  int iVar3;
  LogStream *pLVar4;
  char **ppcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  int iVar8;
  
  ppcVar1 = &(this->impl_).stream_.buffer_.cur_;
  pcVar7 = (this->impl_).stream_.buffer_.cur_;
  iVar8 = (int)ppcVar1;
  iVar3 = iVar8 - (int)pcVar7;
  if (8 < iVar3) {
    builtin_strncpy(pcVar7," -- ",5);
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    pcVar7 = *ppcVar1 + 8;
    *ppcVar1 = pcVar7;
    iVar3 = iVar8 - (int)pcVar7;
  }
  __n = (this->impl_).basename_._M_string_length;
  if ((int)__n < iVar3) {
    memcpy(pcVar7,(this->impl_).basename_._M_dataplus._M_p,__n);
    pcVar7 = (this->impl_).stream_.buffer_.cur_ + __n;
    (this->impl_).stream_.buffer_.cur_ = pcVar7;
    iVar3 = iVar8 - (int)pcVar7;
  }
  if (8 < iVar3) {
    pcVar7[0] = ':';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    *ppcVar1 = *ppcVar1 + 8;
  }
  pLVar4 = LogStream::operator<<((LogStream *)this,(this->impl_).line_);
  ppcVar5 = &(pLVar4->buffer_).cur_;
  pcVar7 = (pLVar4->buffer_).cur_;
  if (1 < (int)ppcVar5 - (int)pcVar7) {
    *pcVar7 = '\n';
    *ppcVar5 = *ppcVar5 + 1;
  }
  pcVar7 = *ppcVar1;
  pthread_once(&once_control_,once_init);
  logline = &(this->impl_).stream_.buffer_;
  AsyncLogging::append(AsyncLogger_,logline->data_,(int)pcVar7 - (int)logline);
  pcVar2 = (this->impl_).basename_._M_dataplus._M_p;
  paVar6 = &(this->impl_).basename_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar6) {
    operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Logger::~Logger(){
    impl_.stream_<<" -- "<<impl_.basename_<<":"<<impl_.line_<<'\n';
    const LogStream::Buffer& buf(stream().buffer());
    output(buf.data(), buf.length());
}